

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool anon_unknown.dwarf_f228c7::isSameEnum(Expression *expr,Type *enumType)

{
  bool bVar1;
  ConditionalExpression *this;
  Expression *in_RSI;
  Expression *in_RDI;
  ConditionalExpression *cond;
  Type *in_stack_00000090;
  Type *in_stack_00000098;
  bool local_21;
  bool local_1;
  
  if (in_RDI->kind == ConditionalOp) {
    this = slang::ast::Expression::as<slang::ast::ConditionalExpression>(in_RDI);
    slang::ast::ConditionalExpression::left(this);
    bVar1 = isSameEnum(in_RSI,(Type *)this);
    local_21 = false;
    if (bVar1) {
      slang::ast::ConditionalExpression::right(this);
      local_21 = isSameEnum(in_RSI,(Type *)this);
    }
    local_1 = local_21;
  }
  else {
    slang::not_null<const_slang::ast::Type_*>::operator->
              ((not_null<const_slang::ast::Type_*> *)0x81a202);
    local_1 = slang::ast::Type::isMatching(in_stack_00000098,in_stack_00000090);
  }
  return local_1;
}

Assistant:

bool isSameEnum(const Expression& expr, const Type& enumType) {
    if (expr.kind == ExpressionKind::ConditionalOp) {
        auto& cond = expr.as<ConditionalExpression>();
        return isSameEnum(cond.left(), enumType) && isSameEnum(cond.right(), enumType);
    }
    return expr.type->isMatching(enumType);
}